

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void fmt::v7::detail::vformat_to<char>
               (buffer<char> *buf,basic_string_view<char> format_str,
               basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               args,locale_ref loc)

{
  format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *pend;
  size_t sVar1;
  undefined1 value [16];
  undefined1 value_00 [16];
  buffer_appender<char> out;
  buffer_appender<char> out_00;
  bool bVar2;
  type tVar3;
  format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *end;
  format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *pfVar4;
  format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *pbegin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar5;
  size_t __n;
  ulong uVar6;
  char *pcVar7;
  basic_format_specs<char> specs;
  format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  h;
  writer write;
  unkbyte10 in_stack_ffffffffffffff58;
  undefined6 in_stack_ffffffffffffff62;
  float local_98;
  undefined4 uStack_94;
  undefined2 uStack_90;
  undefined6 uStack_8e;
  buffer<char> *local_88;
  format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_80;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_78;
  void *local_70;
  buffer_appender<char> local_68;
  char *local_60;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_58;
  locale_ref local_50;
  writer local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  local_78 = args.field_1;
  local_80 = (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)args.desc_;
  aVar5 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
           )format_str.size_;
  pbegin = (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            *)format_str.data_;
  if ((aVar5.values_ !=
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)0x2)
     || (*(short *)pbegin != 0x7d7b)) {
    local_70 = (void *)((ulong)local_70 & 0xffffffff00000000);
    pend = (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            *)(&pbegin->field_0x0 + (long)aVar5);
    local_68.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)buf;
    local_60 = (char *)local_80;
    local_58 = local_78;
    local_50.locale_ = loc.locale_;
    if ((long)aVar5.values_ < 0x20) {
      local_80 = pbegin;
      if (aVar5.values_ !=
          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)0x0
         ) {
        pfVar4 = pbegin;
        do {
          local_78 = aVar5;
          end = (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                 *)&pfVar4->field_0x1;
          if (*(char *)pfVar4 == '}') {
            if ((end == pend) || (*(char *)end != '}')) {
              error_handler::on_error((error_handler *)buf,"unmatched \'}\' in format string");
            }
            buf = (buffer<char> *)&local_88;
            format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            ::on_text((format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                       *)&local_88,(char *)pbegin,(char *)end);
            end = (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                   *)&pfVar4->field_0x2;
            pbegin = end;
          }
          else if (*(char *)pfVar4 == '{') {
            format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            ::on_text((format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                       *)&local_88,(char *)pbegin,(char *)pfVar4);
            end = (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                   *)parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                               ((char *)pfVar4,(char *)pend,
                                (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                 *)&local_88);
            buf = (buffer<char> *)pfVar4;
            pbegin = end;
          }
          pfVar4 = end;
          aVar5 = local_78;
        } while (end != pend);
      }
      local_78 = aVar5;
      format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::on_text((format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                 *)&local_88,(char *)pbegin,(char *)pend);
      return;
    }
    local_80 = pbegin;
    local_48.handler_ =
         (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          *)&local_88;
    do {
      local_78 = aVar5;
      if (pbegin == pend) {
        return;
      }
      pfVar4 = pbegin;
      if (*(char *)pbegin == '{') {
LAB_004d409a:
        parse_format_string<false,_char,_fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&>
        ::writer::operator()(&local_48,(char *)pbegin,(char *)pfVar4);
        pbegin = (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                              ((char *)pfVar4,(char *)pend,
                               (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                *)&local_88);
        bVar2 = true;
      }
      else {
        __n = (long)pend - (long)&pbegin->field_0x1;
        if ((long)__n < 0) {
          assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/core.h"
                      ,0x146,"negative value");
        }
        pfVar4 = (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)memchr(&pbegin->field_0x1,0x7b,__n);
        if (pfVar4 != (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                       *)0x0) goto LAB_004d409a;
        parse_format_string<false,_char,_fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&>
        ::writer::operator()(&local_48,(char *)pbegin,(char *)pend);
        bVar2 = false;
      }
      aVar5 = local_78;
      if (!bVar2) {
        return;
      }
    } while( true );
  }
  local_98 = 0.0;
  if ((long)local_80 < 0) {
    if ((int)(type)args.desc_ < 1) {
      tVar3 = none_type;
    }
    else {
      sVar1 = ((local_78.values_)->field_0).string.size;
      local_98 = (float)((local_78.values_)->field_0).long_long_value;
      uStack_94 = (undefined4)((ulong)((local_78.values_)->field_0).long_long_value >> 0x20);
      uStack_90 = (undefined2)sVar1;
      uStack_8e = (undefined6)(sVar1 >> 0x10);
      tVar3 = (local_78.args_)->type_;
    }
  }
  else {
    tVar3 = (type)args.desc_ & custom_type;
    if (((undefined1  [16])args & (undefined1  [16])0xf) != (undefined1  [16])0x0) {
      sVar1 = ((local_78.values_)->field_0).string.size;
      local_98 = (float)((local_78.values_)->field_0).long_long_value;
      uStack_94 = (undefined4)((ulong)((local_78.values_)->field_0).long_long_value >> 0x20);
      uStack_90 = (undefined2)sVar1;
      uStack_8e = (undefined6)(sVar1 >> 0x10);
    }
  }
  switch(tVar3) {
  case none_type:
    error_handler::on_error((error_handler *)buf,"argument not found");
  case int_type:
    write<char,_fmt::v7::detail::buffer_appender<char>,_int,_0>
              ((buffer_appender<char>)buf,(int)local_98);
    break;
  case uint_type:
    write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
              ((buffer_appender<char>)buf,(uint)local_98);
    break;
  case long_long_type:
    write<char,_fmt::v7::detail::buffer_appender<char>,_long_long,_0>
              ((buffer_appender<char>)buf,CONCAT44(uStack_94,local_98));
    break;
  case ulong_long_type:
    write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long_long,_0>
              ((buffer_appender<char>)buf,CONCAT44(uStack_94,local_98));
    break;
  case int128_type:
    out_00.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._4_4_ = uStack_94;
    out_00.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._0_4_ = local_98;
    value_00._10_6_ = in_stack_ffffffffffffff62;
    value_00._0_10_ = in_stack_ffffffffffffff58;
    write<char,_fmt::v7::detail::buffer_appender<char>,___int128,_0>
              ((detail *)buf,out_00,(__int128)value_00);
    break;
  case uint128_type:
    out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._4_4_ = uStack_94;
    out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._0_4_ = local_98;
    value._10_6_ = in_stack_ffffffffffffff62;
    value._0_10_ = in_stack_ffffffffffffff58;
    write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned___int128,_0>
              ((detail *)buf,out,(unsigned___int128)value);
    break;
  case bool_type:
    pcVar7 = "IsValid_false";
    if (((uint)local_98 & 1) != 0) {
      pcVar7 = "IsValid_true";
    }
    pcVar7 = pcVar7 + 8;
    uVar6 = (ulong)((uint)local_98 & 1) ^ 5;
    goto LAB_004d420b;
  case char_type:
    write<char,fmt::v7::detail::buffer_appender<char>>((buffer_appender<char>)buf,local_98._0_1_);
    break;
  case float_type:
    write<char,_fmt::v7::detail::buffer_appender<char>,_float,_0>
              ((buffer_appender<char>)buf,local_98);
    break;
  case double_type:
    write<char,_fmt::v7::detail::buffer_appender<char>,_double,_0>
              ((buffer_appender<char>)buf,(double)CONCAT44(uStack_94,local_98));
    break;
  case last_numeric_type:
    specs.type = '\0';
    specs._9_1_ = 0;
    specs.fill.data_[0] = ' ';
    specs.fill.data_[1] = '\0';
    specs.fill.data_[2] = '\0';
    specs.fill.data_[3] = '\0';
    specs.fill.size_ = '\x01';
    specs._15_1_ = 0;
    specs.width = 0;
    specs.precision = -1;
    write<char,_fmt::v7::detail::buffer_appender<char>,_long_double,_0>
              ((buffer_appender<char>)buf,
               (longdouble)CONCAT28(uStack_90,CONCAT44(uStack_94,local_98)),specs,(locale_ref)0x0);
    break;
  case cstring_type:
    write<char,fmt::v7::detail::buffer_appender<char>>
              ((buffer_appender<char>)buf,(char *)CONCAT44(uStack_94,local_98));
    break;
  case string_type:
    pcVar7 = (char *)CONCAT44(uStack_94,local_98);
    uVar6 = CONCAT62(uStack_8e,uStack_90);
LAB_004d420b:
    buffer<char>::append<char>(buf,pcVar7,pcVar7 + uVar6);
    break;
  case pointer_type:
    write_ptr<char,fmt::v7::detail::buffer_appender<char>,unsigned_long>
              ((buffer_appender<char>)buf,CONCAT44(uStack_94,local_98),
               (basic_format_specs<char> *)0x0);
    break;
  case custom_type:
    local_48.handler_ =
         (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          *)0x0;
    uStack_40 = 0;
    local_38 = 0;
    local_88 = buf;
    local_70 = loc.locale_;
    (*(code *)CONCAT62(uStack_8e,uStack_90))(CONCAT44(uStack_94,local_98));
    break;
  default:
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format.h"
                ,0x7d7,"");
  }
  return;
}

Assistant:

void detail::vformat_to(
    detail::buffer<Char>& buf, basic_string_view<Char> format_str,
    basic_format_args<buffer_context<type_identity_t<Char>>> args,
    detail::locale_ref loc) {
  using iterator = typename buffer_context<Char>::iterator;
  auto out = buffer_appender<Char>(buf);
  if (format_str.size() == 2 && equal2(format_str.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) error_handler().on_error("argument not found");
    visit_format_arg(default_arg_formatter<iterator, Char>{out, args, loc},
                     arg);
    return;
  }
  format_handler<iterator, Char, buffer_context<Char>> h(out, format_str, args,
                                                         loc);
  parse_format_string<false>(format_str, h);
}